

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banner.cpp
# Opt level: O3

wstring * GetTitleAndDeveloperFromSpecCommandArgument
                    (wstring *__return_storage_ptr__,wifstream *stream,wstring *command_argument)

{
  pointer pwVar1;
  undefined1 auVar2 [16];
  int iVar3;
  wchar_t wVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *in_RCX;
  int iVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  wstring line;
  ulong *local_90;
  ulong *local_88;
  ulong local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pwVar1 = (command_argument->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)__return_storage_ptr__,pwVar1,pwVar1 + command_argument->_M_string_length);
  iVar7 = 2;
  while( true ) {
    iVar3 = std::wistream::get();
    std::wistream::unget();
    if (iVar3 != 0x20) {
      return __return_storage_ptr__;
    }
    bVar8 = iVar7 == 0;
    iVar7 = iVar7 + -1;
    if (bVar8) break;
    local_90 = &local_80;
    local_88 = (ulong *)0x0;
    local_80 = local_80 & 0xffffffff00000000;
    plVar5 = *(long **)(stream + *(long *)(*(long *)stream + -0x18) + 0xf0);
    if (plVar5 == (long *)0x0) {
      auVar9 = std::__throw_bad_cast();
      goto LAB_001038c7;
    }
    wVar4 = (**(code **)(*plVar5 + 0x50))(plVar5,10);
    std::getline<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
              ((wistream *)stream,(wstring *)&local_90,wVar4);
    std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
    std::__cxx11::wstring::find_first_not_of((wchar_t)(wstring *)&local_90,0x20);
    in_RCX = local_88;
    std::__cxx11::wstring::substr((ulong)&local_70,(ulong)&local_90);
    std::__cxx11::wstring::_M_append
              ((wchar_t *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 * 4 + 4);
    }
  }
  stream = (wifstream *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_50,3);
  std::operator+(&local_70,"Title and developer can not be more than ",&local_50);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  auVar2._8_8_ = &local_80;
  auVar2._0_8_ = plVar5;
  auVar9._8_8_ = (ulong *)*plVar5;
  auVar9._0_8_ = plVar5;
  in_RCX = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == in_RCX) {
    local_80 = *in_RCX;
    lStack_78 = plVar5[3];
    goto LAB_001038d4;
  }
LAB_001038c7:
  local_80 = *in_RCX;
  auVar2 = auVar9;
LAB_001038d4:
  local_90 = auVar2._8_8_;
  puVar6 = auVar2._0_8_;
  local_88 = (ulong *)puVar6[1];
  *puVar6 = in_RCX;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  std::runtime_error::runtime_error((runtime_error *)stream,(string *)&local_90);
  __cxa_throw(stream,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::wstring GetTitleAndDeveloperFromSpecCommandArgument(std::wifstream& stream, const std::wstring& command_argument) {
    std::wstring title_and_developer = command_argument;
    constexpr int max_lines = 3;
    int current_line = 1;

    while (true) {
        wchar_t first_char = stream.get();
        stream.unget();
        if (first_char != L' ') {
            return title_and_developer;
        }

        if (current_line++ == max_lines) {
            throw std::runtime_error("Title and developer can not be more than " + std::to_string(max_lines) + " lines");
        }

        std::wstring line;
        std::getline(stream, line);

        title_and_developer += '\n';
        title_and_developer += line.substr(line.find_first_not_of(L' '), line.size());
    }
}